

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonMaximumSuppression.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::NonMaximumSuppression_PickTop::NonMaximumSuppression_PickTop
          (NonMaximumSuppression_PickTop *this,NonMaximumSuppression_PickTop *from)

{
  ulong uVar1;
  
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__NonMaximumSuppression_PickTop_004bb4b0;
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  uVar1 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  this->perclass_ = from->perclass_;
  return;
}

Assistant:

NonMaximumSuppression_PickTop::NonMaximumSuppression_PickTop(const NonMaximumSuppression_PickTop& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite() {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  perclass_ = from.perclass_;
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.NonMaximumSuppression.PickTop)
}